

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pager_write(PgHdr *pPg)

{
  ushort uVar1;
  Pgno PVar2;
  Pager *pPager;
  void *pvVar3;
  sqlite3_vfs *psVar4;
  sqlite3_file *psVar5;
  sqlite3_io_methods *psVar6;
  long lVar7;
  ushort uVar8;
  int iVar9;
  uint uVar10;
  Bitvec *__s;
  MemJournal *p;
  int iVar11;
  uint uVar12;
  long lVar13;
  u32 uVar14;
  bool bVar15;
  uint local_38;
  uint local_34;
  
  pPager = pPg->pPager;
  if (pPager->errCode != 0) {
    return pPager->errCode;
  }
  if (pPager->readOnly != '\0') {
    return 3;
  }
  pvVar3 = pPg->pData;
  if (pPager->eState == '\x02') {
    iVar11 = 0;
    if ((pPager->pWal == (Wal *)0x0) && (pPager->journalMode != '\x02')) {
      psVar4 = pPager->pVfs;
      PVar2 = pPager->dbSize;
      __s = (Bitvec *)sqlite3Malloc(0x200);
      if (__s != (Bitvec *)0x0) {
        iVar11 = 0;
        memset(__s,0,0x200);
        __s->iSize = PVar2;
        pPager->pInJournal = __s;
        psVar5 = pPager->jfd;
        if (psVar5->pMethods == (sqlite3_io_methods *)0x0) {
          if (pPager->journalMode == '\x04') {
            psVar5->pMethods = (sqlite3_io_methods *)0x0;
            psVar5[1].pMethods = (sqlite3_io_methods *)0x0;
            psVar5[4].pMethods = (sqlite3_io_methods *)0x0;
            psVar5[5].pMethods = (sqlite3_io_methods *)0x0;
            psVar5[2].pMethods = (sqlite3_io_methods *)0x0;
            psVar5[3].pMethods = (sqlite3_io_methods *)0x0;
            psVar5->pMethods = &MemJournalMethods;
          }
          else {
            iVar11 = 0x100e;
            if (pPager->tempFile == '\0') {
              iVar11 = 0x806;
            }
            iVar11 = (*psVar4->xOpen)(psVar4,pPager->zJournal,psVar5,iVar11,(int *)0x0);
          }
        }
        if (iVar11 == 0) {
          pPager->nRec = 0;
          pPager->setMaster = '\0';
          pPager->journalOff = 0;
          pPager->journalHdr = 0;
          iVar11 = writeJournalHdr(pPager);
        }
        goto LAB_0015f8ff;
      }
      pPager->pInJournal = (Bitvec *)0x0;
      iVar11 = 7;
    }
    else {
LAB_0015f8ff:
      if (iVar11 == 0) {
        pPager->eState = '\x03';
      }
      else {
        sqlite3BitvecDestroy(pPager->pInJournal);
        pPager->pInJournal = (Bitvec *)0x0;
      }
    }
    if (iVar11 != 0) {
      return iVar11;
    }
  }
  uVar1 = pPg->flags;
  uVar8 = uVar1 & 0xffdf;
  pPg->flags = uVar8;
  if ((uVar1 & 2) == 0) {
    pPg->flags = uVar8 | 2;
    pcacheAddToDirtyList(pPg);
  }
  uVar10 = pPg->pgno;
  iVar11 = sqlite3BitvecTest(pPg->pPager->pInJournal,uVar10);
  if (iVar11 == 0) {
LAB_0015f974:
    uVar12 = 0;
    if (pPager->pWal == (Wal *)0x0) {
      if (uVar10 <= pPager->dbOrigSize) {
        psVar5 = pPager->jfd;
        psVar6 = psVar5->pMethods;
        if (psVar6 != (sqlite3_io_methods *)0x0) {
          lVar7 = pPager->journalOff;
          uVar14 = pPager->cksumInit;
          if (200 < (long)pPager->pageSize) {
            lVar13 = (long)pPager->pageSize + 200;
            do {
              uVar14 = uVar14 + *(byte *)((long)pvVar3 + lVar13 + -400);
              lVar13 = lVar13 + -200;
            } while (400 < lVar13);
          }
          *(byte *)&pPg->flags = (byte)pPg->flags | 4;
          local_38 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                     uVar10 << 0x18;
          uVar12 = (*psVar6->xWrite)(psVar5,&local_38,4,lVar7);
          if ((uVar12 == 0) &&
             (uVar12 = (*pPager->jfd->pMethods->xWrite)
                                 (pPager->jfd,pvVar3,pPager->pageSize,lVar7 + 4), uVar12 == 0)) {
            local_34 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                       uVar14 << 0x18;
            uVar12 = (*pPager->jfd->pMethods->xWrite)
                               (pPager->jfd,&local_34,4,lVar7 + pPager->pageSize + 4);
            if (uVar12 != 0) goto LAB_0015fa68;
            pPager->journalOff = (long)pPager->pageSize + pPager->journalOff + 8;
            pPager->nRec = pPager->nRec + 1;
            uVar10 = sqlite3BitvecSet(pPager->pInJournal,pPg->pgno);
            uVar12 = addToSavepointBitvecs(pPager,pPg->pgno);
            uVar12 = uVar12 | uVar10;
            bVar15 = uVar12 == 0;
          }
          else {
LAB_0015fa68:
            bVar15 = false;
          }
          if (!bVar15) {
            return uVar12;
          }
          goto LAB_0015f980;
        }
      }
      uVar12 = 0;
      if (pPager->eState != '\x04') {
        *(byte *)&pPg->flags = (byte)pPg->flags | 4;
      }
    }
  }
  else {
    iVar9 = subjRequiresPage(pPg);
    uVar12 = 0;
    if (iVar9 == 0) goto LAB_0015f996;
    if (iVar11 == 0) goto LAB_0015f974;
  }
LAB_0015f980:
  iVar11 = subjRequiresPage(pPg);
  if (iVar11 != 0) {
    uVar12 = subjournalPage(pPg);
  }
LAB_0015f996:
  if (pPager->dbSize < pPg->pgno) {
    pPager->dbSize = pPg->pgno;
  }
  return uVar12;
}

Assistant:

static int pager_write(PgHdr *pPg){
  void *pData = pPg->pData;
  Pager *pPager = pPg->pPager;
  int rc = SQLITE_OK;

  /* This routine is not called unless a write-transaction has already 
  ** been started. The journal file may or may not be open at this point.
  ** It is never called in the ERROR state.
  */
  assert( pPager->eState==PAGER_WRITER_LOCKED
       || pPager->eState==PAGER_WRITER_CACHEMOD
       || pPager->eState==PAGER_WRITER_DBMOD
  );
  assert( assert_pager_state(pPager) );

  /* If an error has been previously detected, report the same error
  ** again. This should not happen, but the check provides robustness. */
  if( NEVER(pPager->errCode) )  return pPager->errCode;

  /* Higher-level routines never call this function if database is not
  ** writable.  But check anyway, just for robustness. */
  if( NEVER(pPager->readOnly) ) return SQLITE_PERM;

  CHECK_PAGE(pPg);

  /* The journal file needs to be opened. Higher level routines have already
  ** obtained the necessary locks to begin the write-transaction, but the
  ** rollback journal might not yet be open. Open it now if this is the case.
  **
  ** This is done before calling sqlite3PcacheMakeDirty() on the page. 
  ** Otherwise, if it were done after calling sqlite3PcacheMakeDirty(), then
  ** an error might occur and the pager would end up in WRITER_LOCKED state
  ** with pages marked as dirty in the cache.
  */
  if( pPager->eState==PAGER_WRITER_LOCKED ){
    rc = pager_open_journal(pPager);
    if( rc!=SQLITE_OK ) return rc;
  }
  assert( pPager->eState>=PAGER_WRITER_CACHEMOD );
  assert( assert_pager_state(pPager) );

  /* Mark the page as dirty.  If the page has already been written
  ** to the journal then we can return right away.
  */
  sqlite3PcacheMakeDirty(pPg);
  if( pageInJournal(pPg) && !subjRequiresPage(pPg) ){
    assert( !pagerUseWal(pPager) );
  }else{
  
    /* The transaction journal now exists and we have a RESERVED or an
    ** EXCLUSIVE lock on the main database file.  Write the current page to
    ** the transaction journal if it is not there already.
    */
    if( !pageInJournal(pPg) && !pagerUseWal(pPager) ){
      assert( pagerUseWal(pPager)==0 );
      if( pPg->pgno<=pPager->dbOrigSize && isOpen(pPager->jfd) ){
        u32 cksum;
        char *pData2;
        i64 iOff = pPager->journalOff;

        /* We should never write to the journal file the page that
        ** contains the database locks.  The following assert verifies
        ** that we do not. */
        assert( pPg->pgno!=PAGER_MJ_PGNO(pPager) );

        assert( pPager->journalHdr<=pPager->journalOff );
        CODEC2(pPager, pData, pPg->pgno, 7, return SQLITE_NOMEM, pData2);
        cksum = pager_cksum(pPager, (u8*)pData2);

        /* Even if an IO or diskfull error occurs while journalling the
        ** page in the block above, set the need-sync flag for the page.
        ** Otherwise, when the transaction is rolled back, the logic in
        ** playback_one_page() will think that the page needs to be restored
        ** in the database file. And if an IO error occurs while doing so,
        ** then corruption may follow.
        */
        pPg->flags |= PGHDR_NEED_SYNC;

        rc = write32bits(pPager->jfd, iOff, pPg->pgno);
        if( rc!=SQLITE_OK ) return rc;
        rc = sqlite3OsWrite(pPager->jfd, pData2, pPager->pageSize, iOff+4);
        if( rc!=SQLITE_OK ) return rc;
        rc = write32bits(pPager->jfd, iOff+pPager->pageSize+4, cksum);
        if( rc!=SQLITE_OK ) return rc;

        IOTRACE(("JOUT %p %d %lld %d\n", pPager, pPg->pgno, 
                 pPager->journalOff, pPager->pageSize));
        PAGER_INCR(sqlite3_pager_writej_count);
        PAGERTRACE(("JOURNAL %d page %d needSync=%d hash(%08x)\n",
             PAGERID(pPager), pPg->pgno, 
             ((pPg->flags&PGHDR_NEED_SYNC)?1:0), pager_pagehash(pPg)));

        pPager->journalOff += 8 + pPager->pageSize;
        pPager->nRec++;
        assert( pPager->pInJournal!=0 );
        rc = sqlite3BitvecSet(pPager->pInJournal, pPg->pgno);
        testcase( rc==SQLITE_NOMEM );
        assert( rc==SQLITE_OK || rc==SQLITE_NOMEM );
        rc |= addToSavepointBitvecs(pPager, pPg->pgno);
        if( rc!=SQLITE_OK ){
          assert( rc==SQLITE_NOMEM );
          return rc;
        }
      }else{
        if( pPager->eState!=PAGER_WRITER_DBMOD ){
          pPg->flags |= PGHDR_NEED_SYNC;
        }
        PAGERTRACE(("APPEND %d page %d needSync=%d\n",
                PAGERID(pPager), pPg->pgno,
               ((pPg->flags&PGHDR_NEED_SYNC)?1:0)));
      }
    }
  
    /* If the statement journal is open and the page is not in it,
    ** then write the current page to the statement journal.  Note that
    ** the statement journal format differs from the standard journal format
    ** in that it omits the checksums and the header.
    */
    if( subjRequiresPage(pPg) ){
      rc = subjournalPage(pPg);
    }
  }

  /* Update the database size and return.
  */
  if( pPager->dbSize<pPg->pgno ){
    pPager->dbSize = pPg->pgno;
  }
  return rc;
}